

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int get_command_idx(char *command)

{
  int iVar1;
  int local_1c;
  int i;
  char *command_local;
  
  if ((command != (char *)0x0) && (*command != '\0')) {
    local_1c = 0;
    while (cmdlist[local_1c].name != (char *)0x0) {
      iVar1 = strcmp(command,cmdlist[local_1c].name);
      if ((iVar1 == 0) && ((flags.debug != '\0' || ((cmdlist[local_1c].flags & 0x4000) == 0)))) {
        return local_1c;
      }
      local_1c = local_1c + 1;
    }
  }
  return -1;
}

Assistant:

int get_command_idx(const char *command)
{
	int i;
	
	if (!command || !command[0])
	    return -1;
	
	for (i = 0; cmdlist[i].name; i++)
	    if (!strcmp(command, cmdlist[i].name) &&
		(wizard || !(cmdlist[i].flags & CMD_DEBUG)))
		return i;
	
	return -1;
}